

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O3

bool __thiscall
Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::ValidateContent
          (TopLevelASBase<Diligent::EngineVkImplTraits> *this)

{
  RESOURCE_STATE State;
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  char (*in_R8) [116];
  bool bVar3;
  string _msg;
  char (*in_stack_ffffffffffffff98) [61];
  _Alloc_hider in_stack_ffffffffffffffa0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Hash_node_base *local_40;
  Char *local_38;
  
  bVar3 = (this->m_Instances)._M_h._M_element_count != 0;
  if (!bVar3) {
    FormatString<char[18],char_const*,char[116]>
              ((string *)&stack0xffffffffffffffa0,(Diligent *)"TLAS with name (\'",
               (char (*) [18])
               &(this->
                super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                ).m_Desc,
               (char **)
               "\') doesn\'t have instances, use IDeviceContext::BuildTLAS() or IDeviceContext::CopyTLAS() to initialize TLAS content"
               ,in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,in_stack_ffffffffffffffa0._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffa0._M_p != &local_50) {
      operator_delete(in_stack_ffffffffffffffa0._M_p,local_50._M_allocated_capacity + 1);
    }
  }
  p_Var2 = (this->m_Instances)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      if (*(int *)&p_Var2[5]._M_nxt != *(int *)&p_Var2[4]._M_nxt[0x18]._M_nxt) {
        local_40 = p_Var2[1]._M_nxt;
        FormatString<char[21],char_const*,char[28],char_const*,char[59]>
                  ((string *)&stack0xffffffffffffffa0,(Diligent *)"Instance with name \'",
                   (char (*) [21])&local_40,(char **)"\' contains BLAS with name \'",
                   (char (*) [28])(p_Var2[4]._M_nxt + 3),
                   (char **)"\' that was changed after TLAS build, you must rebuild TLAS",
                   (char (*) [59])in_stack_ffffffffffffff98);
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,in_stack_ffffffffffffffa0._M_p,0,0,0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_ffffffffffffffa0._M_p != &local_50) {
          operator_delete(in_stack_ffffffffffffffa0._M_p,local_50._M_allocated_capacity + 1);
        }
        bVar3 = false;
      }
      p_Var1 = p_Var2[4]._M_nxt;
      State = *(RESOURCE_STATE *)&p_Var1[0xc]._M_nxt;
      if ((State & ~RESOURCE_STATE_BUILD_AS_READ) != RESOURCE_STATE_UNKNOWN) {
        local_40 = p_Var2[1]._M_nxt;
        local_38 = GetResourceStateFlagString(State);
        in_stack_ffffffffffffff98 = (char (*) [61])&local_38;
        FormatString<char[21],char_const*,char[28],char_const*,char[61],char_const*>
                  ((string *)&stack0xffffffffffffffa0,(Diligent *)"Instance with name \'",
                   (char (*) [21])&local_40,(char **)"\' contains BLAS with name \'",
                   (char (*) [28])(p_Var1 + 3),
                   (char **)"\' that must be in BUILD_AS_READ state, but current state is ",
                   in_stack_ffffffffffffff98,(char **)in_stack_ffffffffffffffa0._M_p);
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,in_stack_ffffffffffffffa0._M_p,0,0,0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_ffffffffffffffa0._M_p != &local_50) {
          operator_delete(in_stack_ffffffffffffffa0._M_p,local_50._M_allocated_capacity + 1);
        }
        bVar3 = false;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  return bVar3;
}

Assistant:

bool ValidateContent() const
    {
        bool result = true;

        if (this->m_Instances.empty())
        {
            LOG_ERROR_MESSAGE("TLAS with name ('", this->m_Desc.Name, "') doesn't have instances, use IDeviceContext::BuildTLAS() or IDeviceContext::CopyTLAS() to initialize TLAS content");
            result = false;
        }

        // Validate instances
        for (const auto& NameAndInst : this->m_Instances)
        {
            const InstanceDesc& Inst = NameAndInst.second;

            if (Inst.dvpVersion != Inst.pBLAS->DvpGetVersion())
            {
                LOG_ERROR_MESSAGE("Instance with name '", NameAndInst.first.GetStr(), "' contains BLAS with name '", Inst.pBLAS->GetDesc().Name,
                                  "' that was changed after TLAS build, you must rebuild TLAS");
                result = false;
            }

            if (Inst.pBLAS->IsInKnownState() && Inst.pBLAS->GetState() != RESOURCE_STATE_BUILD_AS_READ)
            {
                LOG_ERROR_MESSAGE("Instance with name '", NameAndInst.first.GetStr(), "' contains BLAS with name '", Inst.pBLAS->GetDesc().Name,
                                  "' that must be in BUILD_AS_READ state, but current state is ",
                                  GetResourceStateFlagString(Inst.pBLAS->GetState()));
                result = false;
            }
        }
        return result;
    }